

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinAnalytic_fp.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  N_Vector u;
  long lVar3;
  FILE *__stream;
  undefined8 *puVar4;
  char *pcVar5;
  long lVar6;
  SUNContext sunctx;
  void *kmem;
  long nfe;
  long nni;
  double local_88;
  double local_80;
  double local_78;
  undefined8 local_70;
  long local_68;
  long local_60;
  long local_58;
  undefined8 local_50;
  long local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  if (argc < 2) {
    local_88 = 1.4901161193847656e-06;
    local_58 = 0x1e;
    local_70 = 0;
    local_78._0_4_ = 0;
    local_80._0_4_ = 0;
    local_68 = 0;
    local_60 = 0;
  }
  else {
    lVar6 = 1;
    local_88 = 1.4901161193847656e-06;
    local_58 = 0x1e;
    local_70 = 0;
    local_78 = 0.0;
    local_80 = 0.0;
    local_68 = 0;
    local_60 = 0;
    do {
      pcVar5 = argv[lVar6];
      iVar1 = strcmp(pcVar5,"--tol");
      if (iVar1 == 0) {
        local_88 = atof(argv[lVar6 + 1]);
      }
      else {
        iVar1 = strcmp(pcVar5,"--maxiter");
        if (iVar1 == 0) {
          iVar1 = atoi(argv[lVar6 + 1]);
          local_58 = (long)iVar1;
        }
        else {
          iVar1 = strcmp(pcVar5,"--m_aa");
          if (iVar1 == 0) {
            iVar1 = atoi(argv[lVar6 + 1]);
            local_60 = (long)iVar1;
          }
          else {
            iVar1 = strcmp(pcVar5,"--delay_aa");
            if (iVar1 == 0) {
              iVar1 = atoi(argv[lVar6 + 1]);
              local_68 = (long)iVar1;
            }
            else {
              iVar1 = strcmp(pcVar5,"--damping_fp");
              if (iVar1 == 0) {
                local_78 = atof(argv[lVar6 + 1]);
              }
              else {
                iVar1 = strcmp(pcVar5,"--damping_aa");
                if (iVar1 == 0) {
                  local_80 = atof(argv[lVar6 + 1]);
                }
                else {
                  iVar1 = strcmp(pcVar5,"--orth_aa");
                  if (iVar1 != 0) {
                    main_cold_1();
                    return 1;
                  }
                  iVar1 = atoi(argv[lVar6 + 1]);
                  local_70 = CONCAT44(extraout_var,iVar1);
                }
              }
            }
          }
        }
      }
      lVar6 = lVar6 + 2;
    } while ((int)lVar6 < argc);
  }
  puts("Solve the nonlinear system:");
  puts("    3x - cos((y-1)z) - 1/2 = 0");
  puts("    x^2 - 81(y-0.9)^2 + sin(z) + 1.06 = 0");
  puts("    exp(-x(y-1)) + 20z + (10 pi - 3)/3 = 0");
  puts("Analytic solution:");
  printf("    x = %g\n",0);
  printf("    y = %g\n",0);
  printf("    z = %g\n",0x382d7370);
  puts("Solution method: Anderson accelerated fixed point iteration.");
  printf("    tolerance    = %g\n",SUB84(local_88,0));
  printf("    max iters    = %ld\n",local_58);
  printf("    m_aa         = %ld\n",local_60);
  printf("    delay_aa     = %ld\n",local_68);
  printf("    damping_aa   = %g\n",local_80._0_4_);
  printf("    damping_fp   = %g\n",local_78._0_4_);
  printf("    orth routine = %d\n",local_70);
  uVar2 = SUNContext_Create(0,&local_50);
  if (uVar2 == 0) {
    u = (N_Vector)N_VNew_Serial(3,local_50);
    if (u == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    lVar6 = N_VClone(u);
    if (lVar6 == 0) {
      main_cold_5();
      return 1;
    }
    lVar3 = KINCreate(local_50);
    local_48 = lVar3;
    if (lVar3 == 0) {
      main_cold_4();
      return 1;
    }
    KINSetMAA(lVar3,local_60);
    uVar2 = KINSetOrthAA(lVar3,local_70);
    if (uVar2 == 0) {
      uVar2 = KINInit(lVar3,FPFunction,u);
      if (uVar2 == 0) {
        uVar2 = KINSetFuncNormTol(SUB84(local_88,0),lVar3);
        if (uVar2 == 0) {
          uVar2 = KINSetNumMaxIters(lVar3,local_58);
          if (uVar2 == 0) {
            if (local_60 == 0) {
              KINSetDamping(local_78._0_4_,lVar3);
            }
            else if (0 < local_60) {
              uVar2 = KINSetDampingAA(local_80._0_4_,lVar3);
              if (uVar2 != 0) {
                pcVar5 = "KINSetDampingAA";
                goto LAB_00101b16;
              }
              uVar2 = KINSetDelayAA(lVar3,local_68);
              if (uVar2 != 0) {
                pcVar5 = "KINSetDelayAA";
                goto LAB_00101b16;
              }
            }
            __stream = fopen("kinsol.log","w");
            if (__stream == (FILE *)0x0) {
              main_cold_3();
              return 1;
            }
            puVar4 = (undefined8 *)N_VGetArrayPointer(u);
            if (puVar4 == (undefined8 *)0x0) {
              main_cold_2();
              return 1;
            }
            *puVar4 = 0x3fb999999999999a;
            puVar4[1] = 0x3fb999999999999a;
            puVar4[2] = 0xbfb999999999999a;
            N_VConst(0,lVar6);
            uVar2 = KINSol(lVar3,u,3,lVar6,lVar6);
            if (uVar2 == 0) {
              uVar2 = KINGetNumNonlinSolvIters(lVar3,&local_38);
              if (uVar2 != 0) {
                fprintf(_stderr,"\nERROR: %s() failed -- returned %d\n\n","KINGetNumNonlinSolvIters"
                        ,(ulong)uVar2);
              }
              uVar2 = KINGetNumFuncEvals(lVar3,&local_40);
              if (uVar2 != 0) {
                fprintf(_stderr,"\nERROR: %s() failed -- returned %d\n\n","KINGetNumFuncEvals",
                        (ulong)uVar2);
              }
              puts("\nFinal Statistics:");
              printf("Number of nonlinear iterations: %6ld\n",local_38);
              printf("Number of function evaluations: %6ld\n",local_40);
              iVar1 = check_ans(u,local_88);
              fclose(__stream);
              N_VDestroy(u);
              N_VDestroy(lVar6);
              KINFree(&local_48);
              SUNContext_Free(&local_50);
              return iVar1;
            }
            pcVar5 = "KINSol";
          }
          else {
            pcVar5 = "KINSetNumMaxItersFuncNormTol";
          }
        }
        else {
          pcVar5 = "KINSetFuncNormTol";
        }
      }
      else {
        pcVar5 = "KINInit";
      }
    }
    else {
      pcVar5 = "KINSetOrthAA";
    }
  }
  else {
    pcVar5 = "SUNContext_Create";
  }
LAB_00101b16:
  fprintf(_stderr,"\nERROR: %s() failed -- returned %d\n\n",pcVar5,(ulong)uVar2);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  int retval     = 0;    /* return value flag   */
  UserOpt uopt   = NULL; /* user options struct */
  N_Vector u     = NULL; /* solution vector     */
  N_Vector scale = NULL; /* scaling vector      */
  FILE* infofp   = NULL; /* KINSOL log file     */
  long int nni, nfe;     /* solver outputs      */
  sunrealtype* data;     /* vector data array   */
  void* kmem;            /* KINSOL memory       */

  /* Set default options */
  retval = SetDefaults(&uopt);
  if (check_retval(&retval, "SetDefaults", 1)) { return (1); }

  retval = ReadInputs(&argc, &argv, uopt);
  if (check_retval(&retval, "ReadInputs", 1))
  {
    free(uopt);
    return (1);
  }

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("Solve the nonlinear system:\n");
  printf("    3x - cos((y-1)z) - 1/2 = 0\n");
  printf("    x^2 - 81(y-0.9)^2 + sin(z) + 1.06 = 0\n");
  printf("    exp(-x(y-1)) + 20z + (10 pi - 3)/3 = 0\n");
  printf("Analytic solution:\n");
  printf("    x = %" GSYM "\n", XTRUE);
  printf("    y = %" GSYM "\n", YTRUE);
  printf("    z = %" GSYM "\n", ZTRUE);
  printf("Solution method: Anderson accelerated fixed point iteration.\n");
  printf("    tolerance    = %" GSYM "\n", uopt->tol);
  printf("    max iters    = %ld\n", uopt->maxiter);
  printf("    m_aa         = %ld\n", uopt->m_aa);
  printf("    delay_aa     = %ld\n", uopt->delay_aa);
  printf("    damping_aa   = %" GSYM "\n", uopt->damping_aa);
  printf("    damping_fp   = %" GSYM "\n", uopt->damping_fp);
  printf("    orth routine = %d\n", uopt->orth_aa);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VClone(u);
  if (check_retval((void*)scale, "N_VClone", 0)) { return (1); }

  /* -----------------------------------------
   * Initialize and allocate memory for KINSOL
   * ----------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* Set number of prior residuals used in Anderson acceleration */
  retval = KINSetMAA(kmem, uopt->m_aa);

  /* Set orthogonalization routine used in Anderson acceleration */
  retval = KINSetOrthAA(kmem, uopt->orth_aa);
  if (check_retval(&retval, "KINSetOrthAA", 1)) { return (1); }

  retval = KINInit(kmem, FPFunction, u);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */
  retval = KINSetFuncNormTol(kmem, uopt->tol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* Set maximum number of iterations */
  retval = KINSetNumMaxIters(kmem, uopt->maxiter);
  if (check_retval(&retval, "KINSetNumMaxItersFuncNormTol", 1)) { return (1); }

  /* Set Fixed point damping parameter */
  if (uopt->m_aa == 0) { retval = KINSetDamping(kmem, uopt->damping_fp); }

  /* Set Anderson acceleration options */
  if (uopt->m_aa > 0)
  {
    /* Set damping parameter */
    retval = KINSetDampingAA(kmem, uopt->damping_aa);
    if (check_retval(&retval, "KINSetDampingAA", 1)) { return (1); }

    /* Set acceleration delay */
    retval = KINSetDelayAA(kmem, uopt->delay_aa);
    if (check_retval(&retval, "KINSetDelayAA", 1)) { return (1); }
  }

  /* Set info log file and print level */
  infofp = fopen("kinsol.log", "w");
  if (check_retval((void*)infofp, "fopen", 0)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  /* Get vector data array */
  data = N_VGetArrayPointer(u);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return (1); }

  data[0] = PTONE;
  data[1] = PTONE;
  data[2] = -PTONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,   /* KINSol memory block */
                  u,      /* initial guess on input; solution vector */
                  KIN_FP, /* global strategy choice */
                  scale,  /* scaling vector, for the variable cc */
                  scale); /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Get solver statistics
   * ------------------------------------ */

  /* get solver stats */
  retval = KINGetNumNonlinSolvIters(kmem, &nni);
  check_retval(&retval, "KINGetNumNonlinSolvIters", 1);

  retval = KINGetNumFuncEvals(kmem, &nfe);
  check_retval(&retval, "KINGetNumFuncEvals", 1);

  printf("\nFinal Statistics:\n");
  printf("Number of nonlinear iterations: %6ld\n", nni);
  printf("Number of function evaluations: %6ld\n", nfe);

  /* ------------------------------------
   * Print solution and check error
   * ------------------------------------ */

  /* check solution */
  retval = check_ans(u, uopt->tol);

  /* -----------
   * Free memory
   * ----------- */

  fclose(infofp);
  N_VDestroy(u);
  N_VDestroy(scale);
  KINFree(&kmem);
  free(uopt);
  SUNContext_Free(&sunctx);

  return (retval);
}